

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O3

bool __thiscall ObjectFile::abortTransaction(ObjectFile *this)

{
  MutexLocker lock;
  MutexLocker MStack_18;
  
  MutexLocker::MutexLocker(&MStack_18,this->objectMutex);
  if (this->inTransaction == true) {
    if (this->transactionLockFile != (File *)0x0) {
      File::unlock(this->transactionLockFile);
      if (this->transactionLockFile != (File *)0x0) {
        (*this->transactionLockFile->_vptr_File[1])();
      }
      this->transactionLockFile = (File *)0x0;
      this->inTransaction = false;
      MutexLocker::~MutexLocker(&MStack_18);
      refresh(this,true);
      return true;
    }
    softHSMLog(3,"abortTransaction",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x349,"Transaction lock file instance invalid!");
  }
  MutexLocker::~MutexLocker(&MStack_18);
  return false;
}

Assistant:

bool ObjectFile::abortTransaction()
{
	{
		MutexLocker lock(objectMutex);

		if (!inTransaction)
		{
			return false;
		}

		if (transactionLockFile == NULL)
		{
			ERROR_MSG("Transaction lock file instance invalid!");

			return false;
		}

		transactionLockFile->unlock();

		delete transactionLockFile;
		transactionLockFile = NULL;
		inTransaction = false;
	}

	// Force reload from disk
	refresh(true);

	return true;
}